

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O3

void __thiscall LogStream::formatInteger<unsigned_int>(LogStream *this,uint v)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char **ppcVar7;
  
  pcVar2 = (this->buffer_).cur_;
  ppcVar7 = &(this->buffer_).cur_;
  if (0x1f < (int)ppcVar7 - (int)pcVar2) {
    lVar5 = 0;
    pcVar6 = pcVar2 + -1;
    do {
      pcVar4 = pcVar6;
      pcVar4[1] = zero[v % 10];
      pcVar6 = pcVar4 + 1;
      lVar5 = lVar5 + 1;
      bVar3 = 9 < v;
      v = v / 10;
    } while (bVar3);
    pcVar4[2] = '\0';
    if (pcVar2 < pcVar6) {
      do {
        pcVar4 = pcVar2 + 1;
        cVar1 = *pcVar2;
        *pcVar2 = *pcVar6;
        *pcVar6 = cVar1;
        pcVar6 = pcVar6 + -1;
        pcVar2 = pcVar4;
      } while (pcVar4 < pcVar6);
    }
    *ppcVar7 = *ppcVar7 + lVar5;
  }
  return;
}

Assistant:

int avail() const { return static_cast<int>(end() - cur_); }